

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

void resizeCharmap(Charmap **map,size_t capacity)

{
  Charmap *pCVar1;
  int *piVar2;
  char *pcVar3;
  
  pCVar1 = (Charmap *)realloc(*map,capacity << 0xb | 0x18);
  *map = pCVar1;
  if (pCVar1 != (Charmap *)0x0) {
    pCVar1->capacity = capacity;
    return;
  }
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  fatalerror("Failed to %s charmap: %s\n","resize",pcVar3);
}

Assistant:

static void resizeCharmap(struct Charmap **map, size_t capacity)
{
	*map = (struct Charmap *)realloc(*map, sizeof(**map) + sizeof(*(*map)->nodes) * capacity);

	if (!*map)
		fatalerror("Failed to %s charmap: %s\n",
			   *map ? "create" : "resize", strerror(errno));
	(**map).capacity = capacity;
}